

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

void __thiscall FIX::IntField::IntField(IntField *this,int field,int data)

{
  string local_38;
  int local_18;
  int local_14;
  int data_local;
  int field_local;
  IntField *this_local;
  
  local_18 = data;
  local_14 = field;
  _data_local = this;
  IntTConvertor<int>::convert_abi_cxx11_(&local_38,(IntTConvertor<int> *)(ulong)(uint)data,data);
  FieldBase::FieldBase(&this->super_FieldBase,field,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_FieldBase)._vptr_FieldBase = (_func_int **)&PTR__IntField_00132680;
  return;
}

Assistant:

explicit IntField(int field, int data)
      : FieldBase(field, IntConvertor::convert(data)) {}